

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_addsub(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  int opsize_00;
  TCGv_i32 pTVar1;
  TCGv_i32 ea_result;
  int opsize;
  int add;
  TCGv_i32 addr;
  TCGv_i32 tmp;
  TCGv_i32 src;
  TCGv_i32 dest;
  TCGv_i32 reg;
  TCGContext_conflict2 *tcg_ctx;
  DisasContext_conflict2 *pDStack_18;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  reg = (TCGv_i32)s->uc->tcg_ctx;
  tcg_ctx._6_2_ = insn;
  pDStack_18 = s;
  s_local = (DisasContext_conflict2 *)env;
  opsize_00 = insn_opsize((uint)insn);
  dest = gen_extend(pDStack_18,
                    *(TCGv_i32 *)(reg + (long)(int)((int)(uint)tcg_ctx._6_2_ >> 9 & 7) * 8 + 0x9458)
                    ,opsize_00,1);
  src = tcg_temp_new_i32((TCGContext_conflict2 *)reg);
  if ((tcg_ctx._6_2_ & 0x100) == 0) {
    addr = dest;
    tmp = gen_ea((CPUM68KState_conflict *)s_local,pDStack_18,tcg_ctx._6_2_,opsize_00,
                 *(TCGv_i32 *)(reg + 0x94f8),(TCGv_i32 *)0x0,EA_LOADS,
                 (uint)(((((pDStack_18->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
    if (tmp == *(TCGv_i32 *)(reg + 0x94f8)) {
      gen_addr_fault(pDStack_18);
      return;
    }
  }
  else {
    addr = gen_ea((CPUM68KState_conflict *)s_local,pDStack_18,tcg_ctx._6_2_,opsize_00,
                  *(TCGv_i32 *)(reg + 0x94f8),(TCGv_i32 *)&opsize,EA_LOADS,
                  (uint)(((((pDStack_18->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
    if (addr == *(TCGv_i32 *)(reg + 0x94f8)) {
      gen_addr_fault(pDStack_18);
      return;
    }
    tmp = dest;
  }
  if ((insn & 0x4000) == 0) {
    tcg_gen_setcond_i32_m68k((TCGContext_conflict2 *)reg,TCG_COND_LTU,QREG_CC_X,addr,tmp);
    tcg_gen_sub_i32((TCGContext_conflict2 *)reg,src,addr,tmp);
    set_cc_op(pDStack_18,opsize_00 + CC_OP_SUBB);
  }
  else {
    tcg_gen_add_i32((TCGContext_conflict2 *)reg,src,addr,tmp);
    tcg_gen_setcond_i32_m68k((TCGContext_conflict2 *)reg,TCG_COND_LTU,QREG_CC_X,src,tmp);
    set_cc_op(pDStack_18,opsize_00 + CC_OP_ADDB);
  }
  gen_update_cc_add((TCGContext_conflict2 *)reg,src,tmp,opsize_00);
  if ((tcg_ctx._6_2_ & 0x100) == 0) {
    gen_partset_reg((TCGContext_conflict2 *)reg,opsize_00,
                    *(TCGv_i32 *)(reg + (long)(int)((int)(uint)tcg_ctx._6_2_ >> 9 & 7) * 8 + 0x9458)
                    ,src);
  }
  else {
    pTVar1 = gen_ea((CPUM68KState_conflict *)s_local,pDStack_18,tcg_ctx._6_2_,opsize_00,src,
                    (TCGv_i32 *)&opsize,EA_STORE,
                    (uint)(((((pDStack_18->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
    if (pTVar1 == *(TCGv_i32 *)(reg + 0x94f8)) {
      gen_addr_fault(pDStack_18);
      return;
    }
  }
  tcg_temp_free_i32((TCGContext_conflict2 *)reg,src);
  return;
}

Assistant:

DISAS_INSN(addsub)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    TCGv dest;
    TCGv src;
    TCGv tmp;
    TCGv addr;
    int add;
    int opsize;

    add = (insn & 0x4000) != 0;
    opsize = insn_opsize(insn);
    reg = gen_extend(s, DREG(insn, 9), opsize, 1);
    dest = tcg_temp_new(tcg_ctx);
    if (insn & 0x100) {
        SRC_EA(env, tmp, opsize, 1, &addr);
        src = reg;
    } else {
        tmp = reg;
        SRC_EA(env, src, opsize, 1, NULL);
    }
    if (add) {
        tcg_gen_add_i32(tcg_ctx, dest, tmp, src);
        tcg_gen_setcond_i32(tcg_ctx, TCG_COND_LTU, QREG_CC_X, dest, src);
        set_cc_op(s, CC_OP_ADDB + opsize);
    } else {
        tcg_gen_setcond_i32(tcg_ctx, TCG_COND_LTU, QREG_CC_X, tmp, src);
        tcg_gen_sub_i32(tcg_ctx, dest, tmp, src);
        set_cc_op(s, CC_OP_SUBB + opsize);
    }
    gen_update_cc_add(tcg_ctx, dest, src, opsize);
    if (insn & 0x100) {
        DEST_EA(env, insn, opsize, dest, &addr);
    } else {
        gen_partset_reg(tcg_ctx, opsize, DREG(insn, 9), dest);
    }
    tcg_temp_free(tcg_ctx, dest);
}